

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall re2::Compiler::FindByteRange(Compiler *this,int root,int id)

{
  Inst *pIVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  LogMessage local_1b0;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)root;
  pIVar1 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
           super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
  if ((pIVar1[root].out_opcode_ & 7) == 2) {
    bVar2 = ByteRangeEqual(this,root,id);
    uVar4 = 0;
    if (!bVar2) {
      root = 0;
    }
    uVar7 = (ulong)(uint)root;
  }
  else {
    bVar2 = this->reversed_;
    do {
      uVar5 = (uint)uVar7;
      uVar6 = pIVar1[(int)uVar5].out_opcode_;
      if ((uVar6 & 7) != 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/compile.cc"
                   ,0x275);
        std::operator<<((ostream *)&local_1b0.str_,"should never happen");
        LogMessage::~LogMessage(&local_1b0);
LAB_001af8cb:
        uVar4 = 0;
        uVar7 = 0;
        goto LAB_001af8da;
      }
      bVar3 = ByteRangeEqual(this,pIVar1[(int)uVar5].field_1.cap_,id);
      if (bVar3) {
        uVar4 = (ulong)(uVar5 * 2 + 1);
        goto LAB_001af8da;
      }
      if ((bVar2 & 1U) == 0) goto LAB_001af8cb;
      uVar6 = uVar6 >> 4;
      uVar7 = (ulong)uVar6;
    } while ((pIVar1[uVar7].out_opcode_ & 7) == 0);
    bVar2 = ByteRangeEqual(this,uVar6,id);
    uVar4 = (ulong)(uVar5 * 2);
    if (!bVar2) {
      uVar4 = 0;
    }
    uVar6 = 0;
    if (bVar2) {
      uVar6 = uVar5;
    }
    uVar7 = (ulong)uVar6;
  }
LAB_001af8da:
  return (Frag)(uVar7 | uVar4 << 0x20);
}

Assistant:

Frag Compiler::FindByteRange(int root, int id) {
  if (inst_[root].opcode() == kInstByteRange) {
    if (ByteRangeEqual(root, id))
      return Frag(root, nullPatchList);
    else
      return NoMatch();
  }

  while (inst_[root].opcode() == kInstAlt) {
    int out1 = inst_[root].out1();
    if (ByteRangeEqual(out1, id))
      return Frag(root, PatchList::Mk((root << 1) | 1));

    // CharClass is a sorted list of ranges, so if out1 of the root Alt wasn't
    // what we're looking for, then we can stop immediately. Unfortunately, we
    // can't short-circuit the search in reverse mode.
    if (!reversed_)
      return NoMatch();

    int out = inst_[root].out();
    if (inst_[out].opcode() == kInstAlt)
      root = out;
    else if (ByteRangeEqual(out, id))
      return Frag(root, PatchList::Mk(root << 1));
    else
      return NoMatch();
  }

  LOG(DFATAL) << "should never happen";
  return NoMatch();
}